

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

LengthInfo * __thiscall
spvtools::opt::analysis::Array::GetConstantLengthInfo
          (LengthInfo *__return_storage_ptr__,Array *this,uint32_t const_id,uint32_t length)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> extra_words;
  undefined4 local_40;
  uint32_t local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_40 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  local_3c = length;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_38,&local_40);
  __return_storage_ptr__->id = const_id;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&__return_storage_ptr__->words,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

Array::LengthInfo Array::GetConstantLengthInfo(uint32_t const_id,
                                               uint32_t length) const {
  std::vector<uint32_t> extra_words{LengthInfo::Case::kConstant, length};
  return {const_id, extra_words};
}